

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O2

bool Cipher::loadFreqMap(char *fname,TFreqMap *res)

{
  pointer pdVar1;
  double *pdVar2;
  _Alloc_hider _Var3;
  TCode TVar4;
  double *p;
  istream *piVar5;
  long lVar6;
  double *pdVar7;
  bool bVar8;
  int n;
  double dVar9;
  undefined1 auStack_268 [4];
  int32_t nfreq;
  value_type_conflict4 local_260;
  string gram;
  ifstream fin;
  byte abStack_218 [488];
  
  res->len = 0;
  pdVar1 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  printf("[+] Loading n-gram file \'%s\'\n",fname);
  std::ifstream::ifstream(&fin,fname,_S_in);
  if (*(int *)(abStack_218 + *(long *)(_fin + -0x18)) == 0) {
    gram._M_dataplus._M_p = (pointer)&gram.field_2;
    gram._M_string_length = 0;
    nfreq = 0;
    gram.field_2._M_local_buf[0] = '\0';
    lVar6 = 0;
    while( true ) {
      res->nTotal = lVar6;
      piVar5 = std::operator>>((istream *)&fin,(string *)&gram);
      std::istream::operator>>(piVar5,&nfreq);
      if ((abStack_218[*(long *)(_fin + -0x18)] & 2) != 0) break;
      lVar6 = (long)nfreq + res->nTotal;
    }
    std::ios::clear((int)auStack_268 + (int)*(long *)(_fin + -0x18) + 0x30);
    std::istream::seekg(&fin,0,0);
    while( true ) {
      piVar5 = std::operator>>((istream *)&fin,(string *)&gram);
      std::istream::operator>>(piVar5,&nfreq);
      bVar8 = (bool)((abStack_218[*(long *)(_fin + -0x18)] & 2) >> 1);
      if (bVar8 != false) break;
      n = res->len;
      if (n == 0) {
        res->len = (int)gram._M_string_length;
        local_260 = 1.0;
        std::vector<double,_std::allocator<double>_>::resize
                  (&res->prob,(long)(1 << ((char)gram._M_string_length * '\x05' & 0x1fU)),&local_260
                  );
        n = res->len;
      }
      else if (n != (int)gram._M_string_length) {
        puts("Error: loaded n-grams with vaying lengths");
        goto LAB_00145a43;
      }
      _Var3._M_p = gram._M_dataplus._M_p;
      TVar4 = calcCode(gram._M_dataplus._M_p,n);
      pdVar7 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + TVar4;
      if (*pdVar7 <= 0.5 && *pdVar7 != 0.5) {
        printf("Error: duplicate n-gram \'%s\'\n",_Var3._M_p);
        goto LAB_00145a43;
      }
      dVar9 = log10((double)nfreq / (double)res->nTotal);
      (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[TVar4] = dVar9;
    }
    printf("    Total n-grams loaded = %g\n",(double)res->nTotal);
    dVar9 = log(10000000.01 / (double)res->nTotal);
    res->pmin = dVar9;
    printf("    P-min = %g\n");
    pdVar2 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar7 = (res->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
      if (0.5 <= *pdVar7) {
        *pdVar7 = res->pmin;
      }
    }
LAB_00145a43:
    std::__cxx11::string::~string((string *)&gram);
  }
  else {
    puts("    Failed to open file");
    bVar8 = false;
  }
  std::ifstream::~ifstream(&fin);
  return bVar8;
}

Assistant:

bool loadFreqMap(const char * fname, TFreqMap & res) {
        auto & len = res.len;
        auto & prob = res.prob;

        len = 0;
        prob.clear();

        printf("[+] Loading n-gram file '%s'\n", fname);
        std::ifstream fin(fname);

        if (fin.good() == false) {
            printf("    Failed to open file\n");
            return false;
        }

        std::string gram;
        int32_t nfreq = 0;
        res.nTotal = 0;

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            res.nTotal += nfreq;
        }

        fin.clear();
        fin.seekg(0);

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            if (len == 0) {
                len = gram.size();
                prob.resize(1 << (5*len), 1.0);
            } else if (len != (int) gram.size()) {
                printf("Error: loaded n-grams with vaying lengths\n");
                return false;
            }

            TCode idx = calcCode(gram.data(), len);
            if (prob[idx] < 0.5) {
                printf("Error: duplicate n-gram '%s'\n", gram.c_str());
                return false;
            }
            prob[idx] = std::log10(((double)(nfreq))/res.nTotal);
        }
        printf("    Total n-grams loaded = %g\n", (double) res.nTotal);

        res.pmin = std::log(10000000.01/res.nTotal);
        printf("    P-min = %g\n", res.pmin);
        for (auto & p : prob) {
            if (p >= 0.5) p = res.pmin;
        }

        return true;
    }